

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double uniform_pdf(double x,double a,double b)

{
  undefined8 local_28;
  double pdf;
  double b_local;
  double a_local;
  double x_local;
  
  if ((x < a) || (b < x)) {
    local_28 = 0.0;
  }
  else {
    local_28 = 1.0 / (b - a);
  }
  return local_28;
}

Assistant:

double uniform_pdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    UNIFORM_PDF evaluates the Uniform PDF.
//
//  Discussion:
//
//    The Uniform PDF is also known as the "Rectangular" or "de Moivre" PDF.
//
//    PDF(A,B;X) = 1 / ( B - A ) for A <= X <= B
//               = 0 otherwise
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double A, B, the parameters of the PDF.
//    A < B.
//
//    Output, double UNIFORM_PDF, the value of the PDF.
//
{
  double pdf;

  if ( x < a || b < x )
  {
    pdf = 0.0;
  }
  else
  {
    pdf = 1.0 / ( b - a );
  }

  return pdf;
}